

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O0

void __thiscall
jetbrains::teamcity::TeamcityMessages::testIgnored
          (TeamcityMessages *this,string *name,string *message,string *flowId)

{
  string local_a0;
  string local_80;
  string local_50;
  RaiiMessage local_30;
  RaiiMessage msg;
  string *flowId_local;
  string *message_local;
  string *name_local;
  TeamcityMessages *this_local;
  
  msg.m_out = (ostream *)flowId;
  anon_unknown_1::RaiiMessage::RaiiMessage(&local_30,"testIgnored",this->m_out);
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  anon_unknown_1::RaiiMessage::writeProperty(&local_30,"name",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_80,(string *)message);
  anon_unknown_1::RaiiMessage::writeProperty(&local_30,"message",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,(string *)msg.m_out);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&local_30,"flowId",&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  anon_unknown_1::RaiiMessage::~RaiiMessage(&local_30);
  return;
}

Assistant:

void TeamcityMessages::testIgnored(const std::string& name, const std::string& message, const std::string& flowId)
{
    RaiiMessage msg("testIgnored", *m_out);
    msg.writeProperty("name", name);
    msg.writeProperty("message", message);
    msg.writePropertyIfNonEmpty("flowId", flowId);
}